

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

void iterate_rc4(uchar *data,size_t data_len,uchar *okey,int key_len,int iterations,bool reverse)

{
  uint uVar1;
  RC4_KEY *key_00;
  undefined4 in_register_0000000c;
  uchar *indata;
  size_t len;
  RC4_KEY *key_01;
  int iVar2;
  undefined4 in_register_00000084;
  byte local_70;
  undefined1 local_60 [8];
  RC4 rc4;
  int j;
  int xor_value;
  int i;
  uchar *key;
  __array key_ph;
  int iStack_24;
  bool reverse_local;
  int iterations_local;
  int key_len_local;
  uchar *okey_local;
  size_t data_len_local;
  uchar *data_local;
  
  indata = (uchar *)CONCAT44(in_register_0000000c,key_len);
  iVar2 = iterations;
  key_ph._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._7_1_ = reverse;
  iStack_24 = key_len;
  _iterations_local = okey;
  okey_local = (uchar *)data_len;
  data_len_local = (size_t)data;
  QIntC::to_size<int>(&stack0xffffffffffffffdc);
  std::make_unique<unsigned_char[]>((size_t)&key);
  key_00 = (RC4_KEY *)
           std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&key);
  for (j = 0; j < iterations; j = j + 1) {
    local_70 = (byte)j;
    if ((key_ph._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
         _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._7_1_ & 1) != 0) {
      local_70 = ((char)iterations + -1) - local_70;
    }
    for (rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         ._4_4_ = 0;
        rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ < iStack_24;
        rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._4_4_ + 1) {
      indata = (uchar *)(long)rc4.crypto.
                              super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi._4_4_;
      indata[(long)(key_00->data + -2)] =
           _iterations_local
           [rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._4_4_] ^ local_70;
    }
    uVar1 = QIntC::to_int<int>(&stack0xffffffffffffffdc);
    RC4::RC4((RC4 *)local_60,key_00,(ulong)uVar1,indata,
             (uchar *)CONCAT44(in_register_00000084,iVar2));
    indata = (uchar *)data_len_local;
    key_01 = (RC4_KEY *)data_len_local;
    RC4::process((RC4 *)local_60,(uchar *)data_len_local,(size_t)okey_local,(uchar *)data_len_local)
    ;
    RC4::~RC4((RC4 *)local_60,key_01,len,indata,(uchar *)CONCAT44(in_register_00000084,iVar2));
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&key);
  return;
}

Assistant:

static void
iterate_rc4(
    unsigned char* data,
    size_t data_len,
    unsigned char* okey,
    int key_len,
    int iterations,
    bool reverse)
{
    auto key_ph = std::make_unique<unsigned char[]>(QIntC::to_size(key_len));
    unsigned char* key = key_ph.get();
    for (int i = 0; i < iterations; ++i) {
        int const xor_value = (reverse ? iterations - 1 - i : i);
        for (int j = 0; j < key_len; ++j) {
            key[j] = static_cast<unsigned char>(okey[j] ^ xor_value);
        }
        RC4 rc4(key, QIntC::to_int(key_len));
        rc4.process(data, data_len, data);
    }
}